

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_header_gen.c
# Opt level: O1

void codePTL(H265eStream *s,H265ePTL *ptl,RK_U32 profilePresentFlag,int maxNumSubLayersMinus1)

{
  int iVar1;
  ulong uVar2;
  ProfileTierLevel *ptl_00;
  
  if (profilePresentFlag != 0) {
    codeProfileTier(s,&ptl->m_generalPTL);
  }
  h265e_stream_write_with_log(s,(ptl->m_generalPTL).m_levelIdc,8,"general_level_idc");
  if (0 < maxNumSubLayersMinus1) {
    uVar2 = 0;
    do {
      if (profilePresentFlag != 0) {
        h265e_stream_write1_with_log
                  (s,ptl->m_subLayerProfilePresentFlag[uVar2],"sub_layer_profile_present_flag[i]");
      }
      h265e_stream_write1_with_log
                (s,ptl->m_subLayerLevelPresentFlag[uVar2],"sub_layer_level_present_flag[i]");
      uVar2 = uVar2 + 1;
    } while ((uint)maxNumSubLayersMinus1 != uVar2);
  }
  if (maxNumSubLayersMinus1 - 1U < 7) {
    iVar1 = maxNumSubLayersMinus1 + -8;
    do {
      h265e_stream_write_with_log(s,0,2,"reserved_zero_2bits");
      iVar1 = iVar1 + 1;
    } while (iVar1 != 0);
  }
  if (0 < maxNumSubLayersMinus1) {
    ptl_00 = ptl->m_subLayerPTL;
    uVar2 = 0;
    do {
      if ((profilePresentFlag != 0) && (ptl->m_subLayerProfilePresentFlag[uVar2] != 0)) {
        codeProfileTier(s,ptl_00);
      }
      if (ptl->m_subLayerLevelPresentFlag[uVar2] != 0) {
        h265e_stream_write_with_log(s,ptl_00->m_levelIdc,8,"sub_layer_level_idc[i]");
      }
      uVar2 = uVar2 + 1;
      ptl_00 = ptl_00 + 1;
    } while ((uint)maxNumSubLayersMinus1 != uVar2);
  }
  return;
}

Assistant:

void codePTL(H265eStream *s, H265ePTL* ptl, RK_U32 profilePresentFlag, int maxNumSubLayersMinus1)
{
    RK_S32 i;
    if (profilePresentFlag) {
        codeProfileTier(s, &ptl->m_generalPTL);
    }
    h265e_stream_write_with_log(s, ptl->m_generalPTL.m_levelIdc, 8, "general_level_idc");

    for (i = 0; i < maxNumSubLayersMinus1; i++) {
        if (profilePresentFlag) {
            h265e_stream_write1_with_log(s, ptl->m_subLayerProfilePresentFlag[i], "sub_layer_profile_present_flag[i]");
        }

        h265e_stream_write1_with_log(s, ptl->m_subLayerLevelPresentFlag[i], "sub_layer_level_present_flag[i]");
    }

    if (maxNumSubLayersMinus1 > 0) {
        for (i = maxNumSubLayersMinus1; i < 8; i++) {
            h265e_stream_write_with_log(s, 0, 2, "reserved_zero_2bits");
        }
    }

    for (i = 0; i < maxNumSubLayersMinus1; i++) {
        if (profilePresentFlag && ptl->m_subLayerProfilePresentFlag[i]) {
            codeProfileTier(s, &ptl->m_subLayerPTL[i]); // sub_layer_...
        }
        if (ptl->m_subLayerLevelPresentFlag[i]) {
            h265e_stream_write_with_log(s, ptl->m_subLayerPTL[i].m_levelIdc, 8, "sub_layer_level_idc[i]");
        }
    }
}